

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileTargetGenerator::MakeEchoProgress(cmMakefileTargetGenerator *this,EchoProgress *progress)

{
  string *str;
  ostream *poVar1;
  string local_240 [48];
  ostringstream local_210 [8];
  ostringstream progressArg;
  cmAlphaNum local_98;
  cmAlphaNum local_68;
  string local_38;
  EchoProgress *local_18;
  EchoProgress *progress_local;
  cmMakefileTargetGenerator *this_local;
  
  local_18 = progress;
  progress_local = (EchoProgress *)this;
  str = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this->LocalGenerator);
  cmAlphaNum::cmAlphaNum(&local_68,str);
  cmAlphaNum::cmAlphaNum(&local_98,"/CMakeFiles");
  cmStrCat<>(&local_38,&local_68,&local_98);
  std::__cxx11::string::operator=((string *)local_18,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::ostringstream::ostringstream(local_210);
  poVar1 = std::operator<<((ostream *)local_210,"$(CMAKE_PROGRESS_");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->NumberOfProgressActions);
  std::operator<<(poVar1,")");
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)&local_18->Arg,local_240);
  std::__cxx11::string::~string(local_240);
  std::__cxx11::ostringstream::~ostringstream(local_210);
  return;
}

Assistant:

void cmMakefileTargetGenerator::MakeEchoProgress(
  cmLocalUnixMakefileGenerator3::EchoProgress& progress) const
{
  progress.Dir =
    cmStrCat(this->LocalGenerator->GetBinaryDirectory(), "/CMakeFiles");
  std::ostringstream progressArg;
  progressArg << "$(CMAKE_PROGRESS_" << this->NumberOfProgressActions << ")";
  progress.Arg = progressArg.str();
}